

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O2

bool __thiscall wasm::Type::isDefaultable(Type *this)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  Type *pTVar4;
  Type *pTVar5;
  bool bVar6;
  Iterator IVar7;
  undefined1 local_48 [8];
  Iterator __begin2;
  Type t;
  
  uVar1 = this->id;
  if ((uVar1 & 1) == 0 || uVar1 < 7) {
    if (uVar1 < 2) {
      bVar6 = false;
    }
    else {
      bVar6 = (uVar1 & 3) != 0 || uVar1 < 7;
    }
  }
  else {
    __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)0x0;
    local_48 = (undefined1  [8])this;
    IVar7 = end(this);
    pTVar4 = (Type *)0x1;
    while (pTVar5 = pTVar4,
          bVar3 = (long)pTVar5 -
                  IVar7.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index ==
                  1,
          bVar2 = IVar7.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent
                  == this, bVar6 = bVar3 && bVar2, !bVar3 || !bVar2) {
      pTVar4 = Iterator::operator*((Iterator *)local_48);
      __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
           pTVar4->id;
      bVar3 = isDefaultable((Type *)&__begin2.
                                     super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                     .index);
      if (!bVar3) {
        return bVar6;
      }
      __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = pTVar5;
      pTVar4 = (Type *)((long)&pTVar5->id + 1);
    }
  }
  return bVar6;
}

Assistant:

bool Type::isDefaultable() const {
  // A variable can get a default value if its type is concrete (unreachable
  // and none have no values, hence no default), and if it's a reference, it
  // must be nullable.
  if (isTuple()) {
    for (auto t : *this) {
      if (!t.isDefaultable()) {
        return false;
      }
    }
    return true;
  }
  return isConcrete() && !isNonNullable();
}